

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

bool __thiscall
helics::CoreBroker::checkInterfaceCreation
          (CoreBroker *this,ActionMessage *message,InterfaceType type)

{
  HandleManager *this_00;
  _Alloc_hider _Var1;
  BasicHandleInfo *pBVar2;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var3;
  InterfaceType type_00;
  byte *pbVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view sVar6;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  ActionMessage eret;
  string local_130;
  ActionMessage local_110;
  char *local_58;
  size_t local_50;
  byte *local_48;
  size_type sStack_40;
  byte *local_38;
  size_t local_30;
  size_t sVar5;
  
  this_00 = &this->handles;
  sVar5 = (message->payload).bufferSize;
  pbVar4 = (message->payload).heap;
  type_00 = type;
  if (type == TRANSLATOR) {
    name._M_str = (char *)pbVar4;
    name._M_len = sVar5;
    pBVar2 = HandleManager::getInterfaceHandle(this_00,name,ENDPOINT);
    if ((pBVar2 == (BasicHandleInfo *)0x0) &&
       (name_00._M_str = (char *)(message->payload).heap,
       name_00._M_len = (message->payload).bufferSize,
       pBVar2 = HandleManager::getInterfaceHandle(this_00,name_00,INPUT),
       pBVar2 == (BasicHandleInfo *)0x0)) {
      sVar5 = (message->payload).bufferSize;
      pbVar4 = (message->payload).heap;
      type_00 = PUBLICATION;
      goto LAB_00350abe;
    }
  }
  else {
LAB_00350abe:
    name_01._M_str = (char *)pbVar4;
    name_01._M_len = sVar5;
    pBVar2 = HandleManager::getInterfaceHandle(this_00,name_01,type_00);
    if (pBVar2 == (BasicHandleInfo *)0x0) {
      if (type == INPUT) {
        return true;
      }
      if ((this->super_BrokerBase).disableDynamicSources == false) {
        return true;
      }
      if ((this->super_BrokerBase).brokerState._M_i != OPERATING) {
        return true;
      }
      _Var3 = gmlc::containers::
              DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              ::find(&this->mFederates,&message->source_id);
      if (_Var3._M_current ==
          (this->mFederates).dataStorage.
          super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ActionMessage::ActionMessage
                  (&local_110,cmd_local_error,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(message->source_id).gid);
        local_110.dest_handle.hid = (message->source_handle).hid;
        local_110.messageID = -1;
        sVar6 = interfaceTypeName(type);
        local_58 = sVar6._M_str;
        local_50 = sVar6._M_len;
        sStack_40 = (message->payload).bufferSize;
        local_48 = (message->payload).heap;
        fmt_01.size_ = 0xdd;
        fmt_01.data_ = (char *)0x3b;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_130,(v11 *)"Source {} not allowed after entering initializing mode ({})",
                   fmt_01,args_01);
        _Var1._M_p = local_130._M_dataplus._M_p;
        if ((byte *)local_130._M_dataplus._M_p == local_110.payload.heap) {
          local_110.payload.bufferSize = local_130._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_110.payload,local_130._M_string_length);
          local_110.payload.bufferSize = local_130._M_string_length;
          if (local_130._M_string_length != 0) {
            memcpy(local_110.payload.heap,_Var1._M_p,local_130._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        propagateError(this,&local_110);
      }
      else {
        if ((((_Var3._M_current)->observer == false) && ((_Var3._M_current)->dynamic == true)) &&
           ((_Var3._M_current)->state == CONNECTED)) {
          return true;
        }
        ActionMessage::ActionMessage
                  (&local_110,cmd_local_error,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(message->source_id).gid);
        local_110.dest_handle.hid = (message->source_handle).hid;
        local_110.messageID = -1;
        sVar6 = interfaceTypeName(type);
        local_58 = sVar6._M_str;
        local_50 = sVar6._M_len;
        local_30 = (message->payload).bufferSize;
        local_38 = (message->payload).heap;
        local_48 = (byte *)((_Var3._M_current)->name)._M_dataplus._M_p;
        sStack_40 = ((_Var3._M_current)->name)._M_string_length;
        fmt_00.size_ = 0xddd;
        fmt_00.data_ = (char *)0x43;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_58;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_130,
                   (v11 *)"Source {} from {} not allowed after entering initializing mode ({})",
                   fmt_00,args_00);
        _Var1._M_p = local_130._M_dataplus._M_p;
        if ((byte *)local_130._M_dataplus._M_p == local_110.payload.heap) {
          local_110.payload.bufferSize = local_130._M_string_length;
        }
        else {
          SmallBuffer::reserve(&local_110.payload,local_130._M_string_length);
          local_110.payload.bufferSize = local_130._M_string_length;
          if (local_130._M_string_length != 0) {
            memcpy(local_110.payload.heap,_Var1._M_p,local_130._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        propagateError(this,&local_110);
      }
      goto LAB_00350baf;
    }
  }
  ActionMessage::ActionMessage
            (&local_110,cmd_local_error,
             (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
             (GlobalFederateId)(message->source_id).gid);
  local_110.dest_handle.hid = (message->source_handle).hid;
  local_110.messageID = -1;
  sVar6 = interfaceTypeName(type);
  local_58 = sVar6._M_str;
  local_50 = sVar6._M_len;
  sStack_40 = (message->payload).bufferSize;
  local_48 = (message->payload).heap;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x17;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_58;
  ::fmt::v11::vformat_abi_cxx11_(&local_130,(v11 *)"Duplicate {} names ({})",fmt,args);
  _Var1._M_p = local_130._M_dataplus._M_p;
  if ((byte *)local_130._M_dataplus._M_p == local_110.payload.heap) {
    local_110.payload.bufferSize = local_130._M_string_length;
  }
  else {
    SmallBuffer::reserve(&local_110.payload,local_130._M_string_length);
    local_110.payload.bufferSize = local_130._M_string_length;
    if (local_130._M_string_length != 0) {
      memcpy(local_110.payload.heap,_Var1._M_p,local_130._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  propagateError(this,&local_110);
LAB_00350baf:
  ActionMessage::~ActionMessage(&local_110);
  return false;
}

Assistant:

bool CoreBroker::checkInterfaceCreation(ActionMessage& message, InterfaceType type)
{
    bool existingName{false};
    if (type == InterfaceType::TRANSLATOR) {
        existingName =
            (handles.getInterfaceHandle(message.name(), InterfaceType::ENDPOINT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::INPUT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::PUBLICATION) != nullptr);
    } else {
        existingName = (handles.getInterfaceHandle(message.name(), type) != nullptr);
    }

    // detect duplicate InterfaceName;
    if (existingName) {
        ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
        eret.dest_handle = message.source_handle;
        eret.messageID = defs::Errors::REGISTRATION_FAILURE;
        eret.payload =
            fmt::format("Duplicate {} names ({})", interfaceTypeName(type), message.name());
        propagateError(std::move(eret));
        return false;
    }
    if (disableDynamicSources && type != InterfaceType::INPUT) {
        if (getBrokerState() == BrokerState::OPERATING) {
            auto fed = mFederates.find(message.source_id);
            if (fed == mFederates.end()) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload =
                    fmt::format("Source {} not allowed after entering initializing mode ({})",
                                interfaceTypeName(type),
                                message.name());
                propagateError(std::move(eret));
                return false;
            }
            if (fed->observer || !fed->dynamic || fed->state != ConnectionState::CONNECTED) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload = fmt::format(
                    "Source {} from {} not allowed after entering initializing mode ({})",
                    interfaceTypeName(type),
                    fed->name,
                    message.name());
                propagateError(std::move(eret));
                return false;
            }
        }
    }
    return true;
}